

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::Block::GetTimeCode(Block *this,Cluster *pCluster)

{
  longlong lVar1;
  Cluster *in_RSI;
  long in_RDI;
  longlong tc;
  longlong tc0;
  undefined8 local_8;
  
  if (in_RSI == (Cluster *)0x0) {
    local_8 = (long)*(short *)(in_RDI + 0x18);
  }
  else {
    lVar1 = Cluster::GetTimeCode(in_RSI);
    if ((lVar1 < 0) || (0x7fffffffffffffff - lVar1 < (long)*(short *)(in_RDI + 0x18))) {
      local_8 = -1;
    }
    else {
      local_8 = lVar1 + *(short *)(in_RDI + 0x18);
    }
  }
  return local_8;
}

Assistant:

long long Block::GetTimeCode(const Cluster* pCluster) const {
  if (pCluster == 0)
    return m_timecode;

  const long long tc0 = pCluster->GetTimeCode();
  assert(tc0 >= 0);

  // Check if tc0 + m_timecode would overflow.
  if (tc0 < 0 || LLONG_MAX - tc0 < m_timecode) {
    return -1;
  }

  const long long tc = tc0 + m_timecode;

  return tc;  // unscaled timecode units
}